

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O3

int __thiscall
RpcClient::IssueRequest
          (RpcClient *this,shared_ptr<RpcMessage> *request,shared_ptr<RpcMessage> *response)

{
  atomic<unsigned_long_long> *paVar1;
  NarpcStaging *this_00;
  __int_type _Var2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  unsigned_long_long ticket;
  char *local_48;
  shared_ptr<RpcMessage> local_40;
  
  LOCK();
  paVar1 = &this->counter_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long_long>)._M_i + 1;
  UNLOCK();
  uVar6 = (ulong)((uint)_Var2 & 7);
  ticket = uVar6 + (uVar6 == 0);
  uVar3 = (int)ticket << 4;
  *(element_type **)
   ((long)&this->responseMap_[0].super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
   (ulong)uVar3) = (response->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&this->responseMap_[0].
                     super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (ulong)uVar3),
             &(response->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  this_00 = &this->staging_;
  NarpcStaging::Clear(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RpcClient::IssueRequest ",0x18);
  (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_RpcMessage
    [4])(&local_48);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48,*(long *)(local_48 + -0x18));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (size ",7);
  iVar4 = (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_RpcMessage[3])();
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::string::_Rep::_M_dispose((allocator *)(local_48 + -0x18));
  iVar4 = (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_RpcMessage[3])();
  NarpcStaging::AddHeader(this_00,iVar4,ticket);
  iVar4 = this->socket_;
  local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  NarpcStaging::SendMessage(this_00,iVar4,&local_40);
  if (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return 0;
}

Assistant:

int RpcClient::IssueRequest(shared_ptr<RpcMessage> request,
                            shared_ptr<RpcMessage> response) {
  unsigned long long ticket = counter_++ % RpcClient::kMaxTicket;
  if (ticket == 0) {
    ticket++;
  }
  responseMap_[ticket] = response;
  // stream_.Clear();
  staging_.Clear();

  cout << "RpcClient::IssueRequest " << request->ToString() << " (size "
       << request->Size() << ")" << endl;

  // serialize header
  // stream_.PutInt(request->Size());
  // stream_.PutLong(ticket);
  staging_.AddHeader(request->Size(), ticket);

  // serialize rpc message
  // request->Write(stream_);

  // write message to network
  // stream_.Write(socket_);
  //
  staging_.SendMessage(socket_, request);

  return 0;
}